

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kernel.cpp
# Opt level: O2

Kernel * Kernel::gaussian(Kernel *__return_storage_ptr__,int width,int height,float sigma)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pfVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  float fVar9;
  
  Kernel(__return_storage_ptr__,width,height);
  fVar9 = sigma * sigma;
  uVar6 = (long)height / -2 & 0xffffffff;
  while (iVar5 = (int)uVar6, iVar5 <= height / 2) {
    iVar1 = __return_storage_ptr__->xoff;
    iVar2 = __return_storage_ptr__->yoff;
    iVar3 = __return_storage_ptr__->width;
    pfVar4 = (__return_storage_ptr__->weights).super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (lVar7 = (long)(width / -2); lVar7 <= width / 2; lVar7 = lVar7 + 1) {
      dVar8 = exp2(((double)(int)lVar7 * (double)(int)lVar7 + (double)iVar5 * (double)iVar5) *
                   -1.4426950408889634 * (1.0 / (double)(fVar9 + fVar9)));
      pfVar4[(long)iVar1 + (iVar2 + iVar5) * iVar3 + lVar7] =
           (float)(dVar8 * 0.15915494309189535 * (1.0 / (double)fVar9));
    }
    uVar6 = (ulong)(iVar5 + 1);
  }
  normalize(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Kernel Kernel::gaussian(int width, int height, float sigma) {
  Kernel g(width, height);
  for (int y = -height / 2; y <= height / 2; y++) {
    for (int x = -width / 2; x <= width / 2; x++) {
      auto sigma_pow2 = (float) std::pow(sigma, 2);
      auto scale = 1 / (2.0 * M_PI * sigma_pow2);
      auto e_pow = std::pow(M_E, -((std::pow(x, 2) + std::pow(y, 2)) / (2 * sigma_pow2)));
      g(x, y) = static_cast<float>(scale * e_pow);
    }
  }
  g.normalize();
  return g;
}